

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall Epoll::epoll_del(Epoll *this,int fd,int event)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined1 local_44 [8];
  epoll_event ev;
  int *target_event;
  _Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false> local_28;
  _Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false> local_20;
  ep_event_map_iter ret;
  int event_local;
  int fd_local;
  Epoll *this_local;
  
  ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._0_4_ = event;
  ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_ = fd;
  std::__detail::_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false>::_Node_iterator
            ((_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false> *)&local_20);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
       ::find(&this->ep_event_map,
              (key_type *)
              ((long)&ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                      _M_cur + 4));
  local_20._M_cur = local_28._M_cur;
  target_event = (int *)std::
                        unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
                        ::end(&this->ep_event_map);
  bVar1 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false> *)
                     &target_event);
  if (!bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false> *)
                        &local_20);
    ev.data.ptr = &ppVar3->second;
    ((io_event *)ev.data.u64)->event =
         ((io_event *)ev.data.u64)->event &
         ((uint)ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur ^
         0xffffffff);
    if (((io_event *)ev.data.u64)->event == 0) {
      epoll_del(this,ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                     _M_cur._4_4_);
    }
    else {
      local_44._0_4_ = ((io_event *)ev.data.u64)->event;
      local_44._4_4_ =
           ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_;
      iVar2 = epoll_ctl(this->ep_epoll_fd,3,
                        ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                        _M_cur._4_4_,(epoll_event *)local_44);
      if ((iVar2 == -1) && (-1 < pr_level)) {
        printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_del",0x47,
               (ulong)ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                      _M_cur._4_4_);
      }
    }
  }
  return;
}

Assistant:

void Epoll::epoll_del(int fd, int event) {

    ep_event_map_iter ret;
    if (ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        return ;
    }

    int &target_event = ret->second.event;

    if (target_event = target_event & (~event); target_event == 0) {
        this->epoll_del(fd);
    }
    else {
        struct epoll_event ev;
        ev.events = target_event;
        ev.data.fd = fd;
        if (epoll_ctl(ep_epoll_fd, EPOLL_CTL_MOD, fd, &ev) == -1) {
            PR_ERROR("epoll ctl error for fd %d\n", fd);
            return;
        }
    }
}